

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uset.cpp
# Opt level: O0

UBool uset_getSerializedRange_63
                (USerializedSet *set,int32_t rangeIndex,UChar32 *pStart,UChar32 *pEnd)

{
  int iVar1;
  uint16_t *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int32_t length;
  int32_t bmpLength;
  uint16_t *array;
  UChar32 *pEnd_local;
  UChar32 *pStart_local;
  int32_t rangeIndex_local;
  USerializedSet *set_local;
  
  if ((((set == (USerializedSet *)0x0) || (rangeIndex < 0)) || (pStart == (UChar32 *)0x0)) ||
     (pEnd == (UChar32 *)0x0)) {
    set_local._7_1_ = '\0';
  }
  else {
    puVar2 = set->array;
    iVar4 = set->length;
    iVar1 = set->bmpLength;
    iVar3 = rangeIndex * 2;
    if (iVar3 < iVar1) {
      iVar5 = iVar3 + 1;
      *pStart = (uint)puVar2[iVar3];
      if (iVar5 < iVar1) {
        *pEnd = puVar2[iVar5] - 1;
      }
      else if (iVar5 < iVar4) {
        *pEnd = CONCAT22(puVar2[iVar5],puVar2[iVar3 + 2]) + -1;
      }
      else {
        *pEnd = 0x10ffff;
      }
      set_local._7_1_ = '\x01';
    }
    else {
      iVar3 = (iVar3 - iVar1) * 2;
      iVar4 = iVar4 - iVar1;
      if (iVar3 < iVar4) {
        *pStart = CONCAT22(puVar2[(long)iVar1 + (long)iVar3],puVar2[(long)iVar1 + (long)(iVar3 + 1)]
                          );
        if (iVar3 + 2 < iVar4) {
          *pEnd = CONCAT22(puVar2[(long)iVar1 + (long)(iVar3 + 2)],
                           puVar2[(long)iVar1 + (long)(iVar3 + 3)]) + -1;
        }
        else {
          *pEnd = 0x10ffff;
        }
        set_local._7_1_ = '\x01';
      }
      else {
        set_local._7_1_ = '\0';
      }
    }
  }
  return set_local._7_1_;
}

Assistant:

U_CAPI UBool U_EXPORT2
uset_getSerializedRange(const USerializedSet* set, int32_t rangeIndex,
                        UChar32* pStart, UChar32* pEnd) {
    const uint16_t* array;
    int32_t bmpLength, length;

    if(set==NULL || rangeIndex<0 || pStart==NULL || pEnd==NULL) {
        return FALSE;
    }

    array=set->array;
    length=set->length;
    bmpLength=set->bmpLength;

    rangeIndex*=2; /* address start/limit pairs */
    if(rangeIndex<bmpLength) {
        *pStart=array[rangeIndex++];
        if(rangeIndex<bmpLength) {
            *pEnd=array[rangeIndex]-1;
        } else if(rangeIndex<length) {
            *pEnd=((((int32_t)array[rangeIndex])<<16)|array[rangeIndex+1])-1;
        } else {
            *pEnd=0x10ffff;
        }
        return TRUE;
    } else {
        rangeIndex-=bmpLength;
        rangeIndex*=2; /* address pairs of pairs of units */
        length-=bmpLength;
        if(rangeIndex<length) {
            array+=bmpLength;
            *pStart=(((int32_t)array[rangeIndex])<<16)|array[rangeIndex+1];
            rangeIndex+=2;
            if(rangeIndex<length) {
                *pEnd=((((int32_t)array[rangeIndex])<<16)|array[rangeIndex+1])-1;
            } else {
                *pEnd=0x10ffff;
            }
            return TRUE;
        } else {
            return FALSE;
        }
    }
}